

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_tests.cpp
# Opt level: O2

void __thiscall
test::iu_CommandLineFlagTest_x_iutest_x_CanBeAccessed_Test::
iu_CommandLineFlagTest_x_iutest_x_CanBeAccessed_Test
          (iu_CommandLineFlagTest_x_iutest_x_CanBeAccessed_Test *this)

{
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_003956a8;
  return;
}

Assistant:

IUTEST(CommandLineFlagTest, CanBeAccessed)
{
    int x = 1;
    EVAL_IUTEST_FLAG( ::iutest::IUTEST_FLAG(also_run_disabled_tests) );
    EVAL_IUTEST_FLAG( ::iutest::IUTEST_FLAG(break_on_failure) );
    EVAL_IUTEST_FLAG( ::iutest::IUTEST_FLAG(catch_exceptions) );
    EVAL_IUTEST_FLAG( ::iutest::IUTEST_FLAG(list_tests) );
    EVAL_IUTEST_FLAG( ::iutest::IUTEST_FLAG(print_time) );
    EVAL_IUTEST_FLAG( ::iutest::IUTEST_FLAG(random_seed) );
    EVAL_IUTEST_FLAG( ::iutest::IUTEST_FLAG(shuffle) );
    EVAL_IUTEST_FLAG( ::iutest::IUTEST_FLAG(throw_on_failure) );
    EVAL_IUTEST_FLAG( ::iutest::IUTEST_FLAG(color) != "unknown" );
    EVAL_IUTEST_FLAG( ::iutest::IUTEST_FLAG(filter) != "unknown" );
#if !defined(IUTEST_USE_GTEST)
    EVAL_IUTEST_FLAG( ::iutest::IUTEST_FLAG(verbose) );
    EVAL_IUTEST_FLAG( ::iutest::IUTEST_FLAG(file_location_style_msvc) );
    EVAL_IUTEST_FLAG( ::iutest::IUTEST_FLAG(list_tests_with_where) );
    EVAL_IUTEST_FLAG( ::iutest::IUTEST_FLAG(default_package_name) != "unknown" );
#endif
        EVAL_IUTEST_FLAG( (::iutest::IUTEST_FLAG(repeat) > 0) );
    IUTEST_EXPECT_NE(0, x);
}